

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeGetLinWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  SUNMatrix p_Var1;
  int iVar2;
  int iVar3;
  long liw;
  long lrw;
  ARKLsMem arkls_mem;
  sunindextype liw1;
  sunindextype lrw1;
  
  if (arkode_mem == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x496,"ARKodeGetLinWorkSpace",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    *leniw = 0;
    *lenrw = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeGetLinWorkSpace",&arkls_mem);
    if (iVar2 == 0) {
      *lenrw = 3;
      *leniw = 0x1e;
      if (arkls_mem->x->ops->nvspace != (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0
         ) {
        N_VSpace(arkls_mem->x,&lrw1,&liw1);
        *lenrw = *lenrw + lrw1 * 2;
        *leniw = *leniw + liw1 * 2;
      }
      p_Var1 = arkls_mem->savedJ;
      if ((p_Var1 != (SUNMatrix)0x0) &&
         (p_Var1->ops->space != (_func_SUNErrCode_SUNMatrix_long_ptr_long_ptr *)0x0)) {
        iVar2 = SUNMatSpace(p_Var1,&lrw,&liw);
        if (iVar2 == 0) {
          *lenrw = *lenrw + lrw;
          *leniw = *leniw + liw;
        }
      }
      iVar2 = 0;
      if (arkls_mem->LS->ops->space != (_func_SUNErrCode_SUNLinearSolver_long_ptr_long_ptr *)0x0) {
        iVar3 = SUNLinSolSpace(arkls_mem->LS,&lrw,&liw);
        iVar2 = 0;
        if (iVar3 == 0) {
          *lenrw = *lenrw + lrw;
          *leniw = *leniw + liw;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int ARKodeGetLinWorkSpace(void* arkode_mem, long int* lenrw, long int* leniw)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  sunindextype lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Return 0 for incompatible steppers */
  if (!ark_mem->step_supports_implicit)
  {
    *lenrw = *leniw = 0;
    return (ARK_SUCCESS);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrw = 3;
  *leniw = 30;

  /* add NVector sizes */
  if (arkls_mem->x->ops->nvspace)
  {
    N_VSpace(arkls_mem->x, &lrw1, &liw1);
    *lenrw += 2 * lrw1;
    *leniw += 2 * liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (arkls_mem->savedJ)
  {
    if (arkls_mem->savedJ->ops->space)
    {
      retval = SUNMatSpace(arkls_mem->savedJ, &lrw, &liw);
      if (retval == 0)
      {
        *lenrw += lrw;
        *leniw += liw;
      }
    }
  }

  /* add LS sizes */
  if (arkls_mem->LS->ops->space)
  {
    retval = SUNLinSolSpace(arkls_mem->LS, &lrw, &liw);
    if (retval == SUN_SUCCESS)
    {
      *lenrw += lrw;
      *leniw += liw;
    }
  }

  return (ARKLS_SUCCESS);
}